

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O1

size_t ZSTD_decompressSequences
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset,int frame)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  undefined8 uVar5;
  seq_t sequence;
  bool bVar6;
  size_t sVar7;
  U32 i;
  long lVar8;
  BYTE *pBVar9;
  byte bVar10;
  byte bVar11;
  BYTE *pBVar12;
  uint uVar13;
  BYTE *oend;
  BYTE *pBVar14;
  size_t unaff_RBX;
  ulong uVar15;
  BYTE *__dest;
  BYTE *litLimit;
  U32 nbBits;
  size_t sVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  BYTE *pBVar20;
  seqState_t seqState;
  BYTE *litPtr;
  BIT_DStream_t local_128;
  ZSTD_fseState local_100;
  ZSTD_fseState local_f0;
  ZSTD_fseState local_e0;
  size_t local_d0 [3];
  ulong uStack_b8;
  BYTE *local_b0;
  BYTE *local_a8;
  BYTE *local_a0;
  ulong local_98;
  ulong uStack_90;
  size_t local_88;
  int local_80;
  uint local_7c;
  size_t local_78;
  BYTE *local_70;
  BYTE *local_68;
  BYTE *local_60;
  ZSTD_DCtx *local_58;
  BYTE *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  oend = (BYTE *)(maxDstSize + (long)dst);
  local_a0 = dctx->litPtr;
  litLimit = local_a0 + dctx->litSize;
  pBVar9 = (BYTE *)dst;
  if (nbSeq == 0) goto LAB_00683160;
  pBVar9 = (BYTE *)dctx->prefixStart;
  local_68 = (BYTE *)dctx->virtualStart;
  local_70 = (BYTE *)dctx->dictEnd;
  dctx->fseEntropy = 1;
  lVar8 = -0xc;
  do {
    *(ulong *)((long)&uStack_b8 + lVar8 * 2) =
         (ulong)*(uint *)((long)(dctx->entropy).workspace + lVar8);
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0);
  local_a8 = (BYTE *)dst;
  if (seqSize == 0) {
    local_128.ptr = (char *)0x0;
    local_128.start = (char *)0x0;
    local_128.bitContainer = 0;
    local_128.bitsConsumed = 0;
    local_128._12_4_ = 0;
    local_128.limitPtr = (char *)0x0;
LAB_006829b8:
    bVar6 = false;
    unaff_RBX = 0xffffffffffffffec;
  }
  else {
    local_128.limitPtr = (char *)((long)seqStart + 8);
    local_128.start = (char *)seqStart;
    if (seqSize < 8) {
      local_128.bitContainer = (size_t)*seqStart;
      switch(seqSize) {
      case 7:
        local_128.bitContainer =
             (ulong)*(byte *)((long)seqStart + 6) << 0x30 | local_128.bitContainer;
      case 6:
        local_128.bitContainer =
             local_128.bitContainer + ((ulong)*(byte *)((long)seqStart + 5) << 0x28);
      case 5:
        local_128.bitContainer =
             local_128.bitContainer + ((ulong)*(byte *)((long)seqStart + 4) << 0x20);
      case 4:
        local_128.bitContainer =
             local_128.bitContainer + (ulong)*(byte *)((long)seqStart + 3) * 0x1000000;
      case 3:
        local_128.bitContainer =
             local_128.bitContainer + (ulong)*(byte *)((long)seqStart + 2) * 0x10000;
      case 2:
        local_128.bitContainer =
             local_128.bitContainer + (ulong)*(byte *)((long)seqStart + 1) * 0x100;
      }
      bVar1 = *(byte *)((long)seqStart + (seqSize - 1));
      uVar19 = 0x1f;
      if (bVar1 != 0) {
        for (; bVar1 >> uVar19 == 0; uVar19 = uVar19 - 1) {
        }
      }
      local_128.bitsConsumed = ~uVar19 + 9;
      if (bVar1 == 0) {
        local_128.bitsConsumed = 0;
      }
      local_128.ptr = (char *)seqStart;
      if (bVar1 == 0) goto LAB_006829b8;
      local_128.bitsConsumed = local_128.bitsConsumed + (int)seqSize * -8 + 0x40;
    }
    else {
      local_128.ptr = (char *)((long)seqStart + (seqSize - 8));
      local_128.bitContainer = *(size_t *)local_128.ptr;
      bVar1 = *(byte *)((long)seqStart + (seqSize - 1));
      uVar19 = 0x1f;
      if (bVar1 != 0) {
        for (; bVar1 >> uVar19 == 0; uVar19 = uVar19 - 1) {
        }
      }
      local_128.bitsConsumed = ~uVar19 + 9;
      if (bVar1 == 0) {
        local_128.bitsConsumed = 0;
      }
      if (bVar1 == 0 || 0xffffffffffffff88 < seqSize) goto LAB_006829b8;
    }
    local_b0 = pBVar9;
    ZSTD_initFseState(&local_100,&local_128,dctx->LLTptr);
    ZSTD_initFseState(&local_f0,&local_128,dctx->OFTptr);
    local_58 = dctx;
    ZSTD_initFseState(&local_e0,&local_128,dctx->MLTptr);
    local_50 = oend + -0x20;
    pBVar9 = local_b0;
    dst = local_a8;
    do {
      sVar7 = local_d0[1];
      local_48 = (ulong)local_100.table[local_100.state].nextState;
      bVar1 = local_100.table[local_100.state].nbAdditionalBits;
      bVar2 = local_100.table[local_100.state].nbBits;
      uVar15 = (ulong)local_100.table[local_100.state].baseValue;
      local_40 = (ulong)local_e0.table[local_e0.state].nextState;
      bVar11 = local_e0.table[local_e0.state].nbAdditionalBits;
      bVar3 = local_e0.table[local_e0.state].nbBits;
      uVar17 = (ulong)local_e0.table[local_e0.state].baseValue;
      bVar4 = local_f0.table[local_f0.state].nbAdditionalBits;
      local_7c = (uint)local_f0.table[local_f0.state].nbBits;
      local_38 = (ulong)local_f0.table[local_f0.state].nextState;
      bVar10 = (byte)local_128.bitsConsumed;
      if (bVar4 < 2) {
        if (bVar4 != 0) {
          local_128.bitsConsumed = local_128.bitsConsumed + 1;
          lVar8 = (ulong)(local_f0.table[local_f0.state].baseValue + (uint)(uVar15 == 0)) -
                  ((long)(local_128.bitContainer << (bVar10 & 0x3f)) >> 0x3f);
          if (lVar8 == 3) {
            sVar16 = local_d0[0] - 1;
          }
          else {
            sVar16 = local_d0[lVar8];
          }
          sVar16 = sVar16 + (sVar16 == 0);
          if (lVar8 != 1) {
            local_d0[2] = local_d0[1];
          }
LAB_0068309e:
          local_d0[1] = local_d0[0];
          goto LAB_00682bb9;
        }
        sVar16 = local_d0[1];
        if (uVar15 == 0) goto LAB_0068309e;
      }
      else {
        local_128.bitsConsumed = local_128.bitsConsumed + bVar4;
        sVar16 = ((local_128.bitContainer << (bVar10 & 0x3f)) >> (-bVar4 & 0x3f)) +
                 (ulong)local_f0.table[local_f0.state].baseValue;
        local_d0[1] = local_d0[0];
        local_d0[2] = sVar7;
LAB_00682bb9:
        local_d0[1] = local_d0[0];
        local_d0[0] = sVar16;
      }
      sVar7 = local_d0[0];
      if (bVar11 != 0) {
        bVar10 = (byte)local_128.bitsConsumed;
        local_128.bitsConsumed = local_128.bitsConsumed + bVar11;
        uVar17 = uVar17 + ((local_128.bitContainer << (bVar10 & 0x3f)) >> (-bVar11 & 0x3f));
      }
      if (0x1e < (byte)(bVar11 + bVar1 + bVar4)) {
        local_80 = nbSeq;
        local_60 = (BYTE *)dst;
        BIT_reloadDStream(&local_128);
        pBVar9 = local_b0;
        dst = local_60;
        nbSeq = local_80;
      }
      if (bVar1 != 0) {
        bVar11 = (byte)local_128.bitsConsumed;
        local_128.bitsConsumed = local_128.bitsConsumed + bVar1;
        uVar15 = uVar15 + ((local_128.bitContainer << (bVar11 & 0x3f)) >> (-bVar1 & 0x3f));
      }
      iVar18 = bVar2 + local_128.bitsConsumed;
      local_100.state =
           ((uint)(local_128.bitContainer >> (-(char)iVar18 & 0x3fU)) & BIT_mask[bVar2]) + local_48;
      iVar18 = iVar18 + (uint)bVar3;
      local_e0.state =
           ((uint)(local_128.bitContainer >> (-(char)iVar18 & 0x3fU)) & BIT_mask[(uint)bVar3]) +
           local_40;
      uVar19 = iVar18 + local_7c;
      local_f0.state =
           ((uint)(local_128.bitContainer >> (-(char)uVar19 & 0x3fU)) & BIT_mask[local_7c]) +
           local_38;
      local_128.bitsConsumed = uVar19;
      local_98 = uVar15;
      uStack_90 = uVar17;
      local_88 = sVar7;
      pBVar20 = local_a0 + uVar15;
      if ((litLimit < pBVar20) ||
         (sVar16 = uVar17 + uVar15, local_50 < (BYTE *)((long)dst + sVar16))) {
        sequence.matchLength = uVar17;
        sequence.litLength = uVar15;
        sequence.offset = sVar7;
        sVar16 = ZSTD_execSequenceEnd
                           ((BYTE *)dst,oend,sequence,&local_a0,litLimit,pBVar9,local_68,local_70);
        pBVar9 = local_b0;
      }
      else {
        uVar5 = *(undefined8 *)(local_a0 + 8);
        *(undefined8 *)dst = *(undefined8 *)local_a0;
        *(undefined8 *)((long)dst + 8) = uVar5;
        if (0x10 < uVar15) {
          ZSTD_decompressSequences_cold_1();
          pBVar9 = local_b0;
        }
        __dest = (BYTE *)((long)dst + uVar15);
        local_a0 = pBVar20;
        pBVar20 = __dest + -sVar7;
        if ((ulong)((long)__dest - (long)pBVar9) < local_88) {
          if ((ulong)((long)__dest - (long)local_68) < local_88) {
            sVar16 = 0xffffffffffffffec;
          }
          else {
            lVar8 = (long)(__dest + -sVar7) - (long)pBVar9;
            pBVar20 = local_70 + lVar8;
            if (local_70 < pBVar20 + uStack_90) {
              memmove(__dest,pBVar20,-lVar8);
              __dest = __dest + -lVar8;
              uStack_90 = uStack_90 + lVar8;
              pBVar20 = pBVar9;
              goto LAB_00682d92;
            }
            memmove(__dest,pBVar20,uStack_90);
          }
        }
        else {
LAB_00682d92:
          if (local_88 < 0x10) {
            if (local_88 < 8) {
              iVar18 = *(int *)(ZSTD_overlapCopy8_dec64table + local_88 * 4);
              *__dest = *pBVar20;
              __dest[1] = pBVar20[1];
              __dest[2] = pBVar20[2];
              __dest[3] = pBVar20[3];
              pBVar14 = pBVar20 + *(uint *)(ZSTD_overlapCopy8_dec32table + local_88 * 4);
              pBVar20 = pBVar20 + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + local_88 * 4) -
                                  (long)iVar18);
              *(undefined4 *)(__dest + 4) = *(undefined4 *)pBVar14;
            }
            else {
              *(undefined8 *)__dest = *(undefined8 *)pBVar20;
            }
            if (8 < uStack_90) {
              pBVar14 = pBVar20 + 8;
              pBVar12 = __dest + 8;
              if ((long)pBVar12 - (long)pBVar14 < 0x10) {
                do {
                  *(undefined8 *)pBVar12 = *(undefined8 *)pBVar14;
                  pBVar12 = pBVar12 + 8;
                  pBVar14 = pBVar14 + 8;
                } while (pBVar12 < __dest + uStack_90);
              }
              else {
                uVar5 = *(undefined8 *)(pBVar20 + 0x10);
                *(undefined8 *)pBVar12 = *(undefined8 *)pBVar14;
                *(undefined8 *)(__dest + 0x10) = uVar5;
                if (0x18 < (long)uStack_90) {
                  lVar8 = 0;
                  do {
                    uVar5 = *(undefined8 *)(pBVar20 + lVar8 + 0x18 + 8);
                    pBVar14 = __dest + lVar8 + 0x18;
                    *(undefined8 *)pBVar14 = *(undefined8 *)(pBVar20 + lVar8 + 0x18);
                    *(undefined8 *)(pBVar14 + 8) = uVar5;
                    uVar5 = *(undefined8 *)(pBVar20 + lVar8 + 0x28 + 8);
                    *(undefined8 *)(pBVar14 + 0x10) = *(undefined8 *)(pBVar20 + lVar8 + 0x28);
                    *(undefined8 *)(pBVar14 + 0x18) = uVar5;
                    lVar8 = lVar8 + 0x20;
                  } while (pBVar14 + 0x20 < __dest + uStack_90);
                }
              }
            }
          }
          else {
            uVar5 = *(undefined8 *)(pBVar20 + 8);
            *(undefined8 *)__dest = *(undefined8 *)pBVar20;
            *(undefined8 *)(__dest + 8) = uVar5;
            if (0x10 < (long)uStack_90) {
              lVar8 = 0x10;
              do {
                uVar5 = *(undefined8 *)(pBVar20 + lVar8 + 8);
                pBVar14 = __dest + lVar8;
                *(undefined8 *)pBVar14 = *(undefined8 *)(pBVar20 + lVar8);
                *(undefined8 *)(pBVar14 + 8) = uVar5;
                uVar5 = *(undefined8 *)(pBVar20 + lVar8 + 0x10 + 8);
                *(undefined8 *)(pBVar14 + 0x10) = *(undefined8 *)(pBVar20 + lVar8 + 0x10);
                *(undefined8 *)(pBVar14 + 0x18) = uVar5;
                lVar8 = lVar8 + 0x20;
              } while (pBVar14 + 0x20 < __dest + uStack_90);
            }
          }
        }
      }
      if (sVar16 < 0xffffffffffffff89) {
        dst = (void *)((long)dst + sVar16);
        iVar18 = 0;
        nbSeq = nbSeq + -1;
        if (nbSeq == 0) {
          iVar18 = 5;
          bVar6 = false;
        }
        else {
          bVar6 = true;
          if (local_128.bitsConsumed < 0x41) {
            if (local_128.ptr < local_128.limitPtr) {
              if (local_128.ptr == local_128.start) goto LAB_00682e96;
              uVar19 = (int)local_128.ptr - (int)local_128.start;
              if (local_128.start <=
                  (ulong *)((long)local_128.ptr - (ulong)(local_128.bitsConsumed >> 3))) {
                uVar19 = local_128.bitsConsumed >> 3;
              }
              uVar13 = local_128.bitsConsumed + uVar19 * -8;
              pBVar9 = local_b0;
            }
            else {
              uVar19 = local_128.bitsConsumed >> 3;
              uVar13 = local_128.bitsConsumed & 7;
            }
            local_128.ptr = (char *)((long)local_128.ptr - (ulong)uVar19);
            local_128.bitsConsumed = uVar13;
            local_128.bitContainer = *(size_t *)local_128.ptr;
          }
        }
      }
      else {
        iVar18 = 1;
        bVar6 = false;
        local_78 = sVar16;
      }
LAB_00682e96:
    } while (iVar18 == 0);
    unaff_RBX = local_78;
    if (iVar18 == 5) {
      unaff_RBX = 0xffffffffffffffec;
      if (nbSeq == 0) {
        if (local_128.bitsConsumed < 0x41) {
          if (local_128.ptr < local_128.limitPtr) {
            if (local_128.ptr != local_128.start) {
              uVar15 = (ulong)(uint)((int)local_128.ptr - (int)local_128.start);
              if (local_128.start <=
                  (ulong *)((long)local_128.ptr - (ulong)(local_128.bitsConsumed >> 3))) {
                uVar15 = (ulong)(local_128.bitsConsumed >> 3);
              }
              uVar19 = local_128.bitsConsumed + (int)uVar15 * -8;
              goto LAB_0068321b;
            }
            if (local_128.bitsConsumed == 0x40) goto LAB_0068312c;
          }
          else {
            uVar15 = (ulong)(local_128.bitsConsumed >> 3);
            uVar19 = local_128.bitsConsumed & 7;
LAB_0068321b:
            local_128.ptr = (char *)((long)local_128.ptr - uVar15);
            local_128.bitsConsumed = uVar19;
            local_128.bitContainer = *(size_t *)local_128.ptr;
          }
          bVar6 = false;
        }
        else {
LAB_0068312c:
          lVar8 = 0;
          do {
            (local_58->entropy).rep[lVar8] = (U32)local_d0[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          bVar6 = true;
          unaff_RBX = local_78;
        }
      }
      else {
        bVar6 = false;
      }
    }
  }
  pBVar9 = local_a8;
  if (!bVar6) {
    return unaff_RBX;
  }
LAB_00683160:
  uVar17 = (long)litLimit - (long)local_a0;
  uVar15 = (long)oend - (long)dst;
  if (uVar15 < uVar17) {
    unaff_RBX = 0xffffffffffffffba;
  }
  else if ((BYTE *)dst == (BYTE *)0x0) {
    dst = (BYTE *)0x0;
  }
  else {
    memcpy(dst,local_a0,uVar17);
    dst = (void *)((long)dst + uVar17);
  }
  if (uVar17 <= uVar15) {
    unaff_RBX = (long)dst - (long)pBVar9;
  }
  return unaff_RBX;
}

Assistant:

static size_t
ZSTD_decompressSequences(ZSTD_DCtx* dctx, void* dst, size_t maxDstSize,
                   const void* seqStart, size_t seqSize, int nbSeq,
                   const ZSTD_longOffset_e isLongOffset,
                   const int frame)
{
    DEBUGLOG(5, "ZSTD_decompressSequences");
#if DYNAMIC_BMI2
    if (dctx->bmi2) {
        return ZSTD_decompressSequences_bmi2(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset, frame);
    }
#endif
  return ZSTD_decompressSequences_default(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset, frame);
}